

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::emitPlyMesh(SemanticParser *this,SP *shape)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  element_type *peVar7;
  long lVar8;
  element_type *peVar9;
  element_type *peVar10;
  float fVar11;
  size_type sVar12;
  vec3f *v;
  element_type *peVar13;
  element_type *peVar14;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  SP SVar27;
  SP ours;
  string fileName;
  undefined1 local_c9;
  string local_c8;
  undefined1 local_a0 [32];
  SP local_80;
  SP local_70;
  _Base_ptr local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar7 = shape[1].super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar8 = *in_RDX;
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"filename","");
  syntactic::ParamSet::getParamString(&local_c8,(ParamSet *)(lVar8 + 8),(string *)local_a0);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(peVar7->transform).atStart.l.vz,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_60 = *(_Base_ptr *)(*in_RDX + 0x58);
  local_58 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*in_RDX + 0x60);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_a0,(SP *)shape);
  local_c8._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::TriangleMesh,std::allocator<pbrt::TriangleMesh>,std::shared_ptr<pbrt::Material>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length,
             (TriangleMesh **)&local_c8,(allocator<pbrt::TriangleMesh> *)&local_c9,
             (shared_ptr<pbrt::Material> *)local_a0);
  std::__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::TriangleMesh,pbrt::TriangleMesh>
            ((__shared_ptr<pbrt::TriangleMesh,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
             (TriangleMesh *)local_c8._M_dataplus._M_p);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  pbrt::ply::parse(&local_50,
                   (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                   (local_c8._M_dataplus._M_p + 0x70),
                   (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                   (local_c8._M_dataplus._M_p + 0x88),
                   (vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)
                   (local_c8._M_dataplus._M_p + 0xa0),
                   (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
                   (local_c8._M_dataplus._M_p + 0xb8));
  lVar8 = *in_RDX;
  fVar1 = *(float *)(lVar8 + 0x78);
  fVar2 = *(float *)(lVar8 + 0x84);
  fVar3 = *(float *)(lVar8 + 0x98);
  peVar13 = (element_type *)
            (((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             (local_c8._M_dataplus._M_p + 0x70))->
            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)._M_impl.
            super__Vector_impl_data._M_start;
  peVar9 = (element_type *)
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._M_dataplus._M_p + 0x78))->_M_pi
  ;
  fVar22 = (float)*(undefined8 *)(lVar8 + 0x7c);
  fVar23 = (float)((ulong)*(undefined8 *)(lVar8 + 0x7c) >> 0x20);
  fVar25 = (float)((ulong)*(undefined8 *)(lVar8 + 0x88) >> 0x20);
  fVar17 = (float)*(undefined8 *)(lVar8 + 0x90);
  fVar18 = (float)((ulong)*(undefined8 *)(lVar8 + 0x90) >> 0x20);
  fVar24 = (float)*(undefined8 *)(lVar8 + 0x88);
  if (peVar13 != peVar9) {
    uVar5 = *(undefined8 *)(lVar8 + 0x9c);
    fVar16 = *(float *)(lVar8 + 0xa4);
    do {
      fVar19 = *(float *)&(peVar13->super_Entity).super_enable_shared_from_this<pbrt::Entity>.
                          _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
      pp_Var6 = (peVar13->super_Entity)._vptr_Entity;
      fVar21 = SUB84(pp_Var6,0);
      fVar26 = (float)((ulong)pp_Var6 >> 0x20);
      (peVar13->super_Entity)._vptr_Entity =
           (_func_int **)
           CONCAT44(fVar19 * fVar18 + fVar24 * fVar26 + fVar22 * fVar21 +
                    (float)((ulong)uVar5 >> 0x20),
                    fVar19 * fVar17 + fVar1 * fVar21 + fVar2 * fVar26 + (float)uVar5);
      *(float *)&(peVar13->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           fVar26 * fVar25 + fVar21 * fVar23 + fVar3 * fVar19 + fVar16;
      peVar13 = (element_type *)
                ((long)&(peVar13->super_Entity).super_enable_shared_from_this<pbrt::Entity>.
                        _M_weak_this.super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4)
      ;
    } while (peVar13 != peVar9);
  }
  peVar14 = (element_type *)
            (((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             (local_c8._M_dataplus._M_p + 0x88))->
            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)._M_impl.
            super__Vector_impl_data._M_start;
  peVar10 = (element_type *)
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._M_dataplus._M_p + 0x90))->_M_pi;
  if (peVar14 != peVar10) {
    fVar26 = fVar17 * fVar25 - fVar3 * fVar2;
    fVar16 = fVar3 * fVar24 - fVar18 * fVar25;
    fVar19 = fVar18 * fVar2 - fVar17 * fVar24;
    fVar21 = 1.0 / (fVar19 * fVar23 + fVar1 * fVar16 + fVar26 * fVar22);
    do {
      fVar11 = SUB84(peVar14->_vptr_Entity,0);
      fVar20 = (float)((ulong)peVar14->_vptr_Entity >> 0x20);
      fVar4 = *(float *)&(peVar14->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                         super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar14->_vptr_Entity =
           (_func_int **)
           CONCAT44(fVar4 * (fVar2 * fVar23 - fVar1 * fVar25) * fVar21 +
                    (fVar1 * fVar3 - fVar23 * fVar17) * fVar21 * fVar20 + fVar26 * fVar21 * fVar11,
                    fVar4 * (fVar25 * fVar22 - fVar23 * fVar24) * fVar21 +
                    fVar16 * fVar21 * fVar11 + (fVar23 * fVar18 - fVar22 * fVar3) * fVar21 * fVar20)
      ;
      *(float *)&(peVar14->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                 super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           fVar11 * fVar21 * fVar19 + fVar20 * (fVar17 * fVar22 - fVar18 * fVar1) * fVar21 +
           fVar4 * fVar21 * (fVar24 * fVar1 - fVar2 * fVar22);
      peVar14 = (element_type *)
                ((long)&(peVar14->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this.
                        super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
    } while (peVar14 != peVar10);
  }
  local_70.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._M_dataplus._M_p;
  local_70.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length;
  if ((_Base_ptr)local_c8._M_string_length != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_c8._M_string_length + 8) = *(int *)(local_c8._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_c8._M_string_length + 8) = *(int *)(local_c8._M_string_length + 8) + 1;
    }
  }
  local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_70,&local_80);
  _Var15._M_pi = extraout_RDX;
  if (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var15._M_pi = extraout_RDX_00;
  }
  if ((_Base_ptr)
      local_70.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var15._M_pi = extraout_RDX_01;
  }
  sVar12 = local_c8._M_string_length;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8._M_string_length = 0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._M_dataplus._M_p;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    _Var15._M_pi = extraout_RDX_02;
  }
  SVar27.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  SVar27.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar27.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitPlyMesh(pbrt::syntactic::Shape::SP shape)
  {
    const std::string fileName
      = pbrtScene->makeGlobalFileName(shape->getParamString("filename"));
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));
    ply::parse(fileName,ours->vertex,ours->normal,ours->texcoord,ours->index);

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);

    extractTextures(ours,shape);
    return ours;
  }